

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O1

void __thiscall r_exec::_Mem::store(_Mem *this,Code *object)

{
  atomic_int_fast64_t *paVar1;
  int64_t location;
  P<r_code::Code> local_18;
  int64_t local_10;
  
  if (object != (Code *)0x0) {
    LOCK();
    paVar1 = &(object->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_18.object = &object->super__Object;
  r_code::list<core::P<r_code::Code>_>::push_back(&this->objects,&local_18,&local_10);
  if ((Code *)local_18.object != (Code *)0x0) {
    LOCK();
    ((local_18.object)->refCount).super___atomic_base<long>._M_i =
         ((local_18.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_18.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*((_Object *)&(local_18.object)->_vptr__Object)->_vptr__Object[1])();
    }
  }
  object->storage_index = local_10;
  return;
}

Assistant:

void _Mem::store(Code *object)
{
    int64_t location;
    objects.push_back(object, location);
    object->set_stroage_index(location);
}